

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plot-intermediate.cxx
# Opt level: O1

int main(int argc,char **argv)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  string *fileName;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  Solution solution;
  Parameters parameters;
  Problem problem;
  SolutionGraph solutionGraph;
  ProblemGraph problemGraph;
  string local_200;
  Solution local_1e0;
  Parameters local_1c8;
  Problem local_168;
  SolutionGraph local_120;
  ProblemGraph local_a8;
  
  parseCommandLine(&local_1c8,argc,argv);
  local_168.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_168.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_168.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_168.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lineage::loadNodes(&local_1c8.nodesFileName,&local_168);
  lineage::loadEdges(&local_1c8.edgesFileName,&local_168);
  lineage::ProblemGraph::ProblemGraph(&local_a8,&local_168);
  fileName = &local_1c8.solutionName;
  lineage::loadSolution(&local_1e0,fileName);
  lineage::SolutionGraph::SolutionGraph(&local_120,&local_a8,&local_1e0);
  std::__cxx11::string::substr((ulong)&local_200,(ulong)fileName);
  std::__cxx11::string::operator=((string *)fileName,(string *)&local_200);
  paVar1 = &local_200.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  lineage::SolutionGraph::save(&local_120,fileName);
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_200,local_1c8.solutionName._M_dataplus._M_p,
             local_1c8.solutionName._M_dataplus._M_p + local_1c8.solutionName._M_string_length);
  std::__cxx11::string::append((char *)&local_200);
  lineage::SolutionGraph::saveSVG(&local_120,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p,local_200.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_120.nodesOfCell_);
  if (local_120.lineageGraph_.edges_.
      super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.lineageGraph_.edges_.
                    super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_120.lineageGraph_.edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.lineageGraph_.edges_.
                          super__Vector_base<andres::graph::detail::Edge<true,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<true,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
  ::~vector(&local_120.lineageGraph_.vertices_);
  if (local_120.cellOfNode_.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_120.cellOfNode_.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_120.cellOfNode_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_120.cellOfNode_.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_1e0.edge_labels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_1e0.edge_labels.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_1e0.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_1e0.edge_labels.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a8.nodeIndicesInFrame_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a8.edgeIndicesInFrame_);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector(&local_a8.edgeIndicesFromFrame_);
  if (local_a8.graph_.edges_.
      super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
      ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_a8.graph_.edges_.
                    super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_start,
                    (long)local_a8.graph_.edges_.
                          super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage -
                    (long)local_a8.graph_.edges_.
                          super__Vector_base<andres::graph::detail::Edge<false,_unsigned_long>,_std::allocator<andres::graph::detail::Edge<false,_unsigned_long>_>_>
                          ._M_impl.super__Vector_impl_data._M_start);
  }
  std::
  vector<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>,_std::allocator<andres::RandomAccessSet<andres::graph::Adjacency<unsigned_long>,_std::less<andres::graph::Adjacency<unsigned_long>_>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>_>
  ::~vector(&local_a8.graph_.vertices_);
  if (local_168.node_offsets.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.node_offsets.
                    super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.node_offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.node_offsets.
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.edges.super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.edges.
                    super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.edges.
                          super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.edges.
                          super__Vector_base<lineage::Edge,_std::allocator<lineage::Edge>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if (local_168.nodes.super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_168.nodes.
                    super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_168.nodes.
                          super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_168.nodes.
                          super__Vector_base<lineage::Node,_std::allocator<lineage::Node>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.solutionName._M_dataplus._M_p != &local_1c8.solutionName.field_2) {
    operator_delete(local_1c8.solutionName._M_dataplus._M_p,
                    local_1c8.solutionName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.nodesFileName._M_dataplus._M_p != &local_1c8.nodesFileName.field_2) {
    operator_delete(local_1c8.nodesFileName._M_dataplus._M_p,
                    local_1c8.nodesFileName.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c8.edgesFileName._M_dataplus._M_p != &local_1c8.edgesFileName.field_2) {
    operator_delete(local_1c8.edgesFileName._M_dataplus._M_p,
                    local_1c8.edgesFileName.field_2._M_allocated_capacity + 1);
  }
  return 0;
}

Assistant:

int main(int argc, char** argv)
try
{
    auto parameters = parseCommandLine(argc, argv);

    // load problem:
    auto problem = lineage::loadProblem(parameters.nodesFileName, parameters.edgesFileName);

    lineage::ProblemGraph problemGraph(problem);

    auto solution = lineage::loadSolution(parameters.solutionName);
    
    lineage::SolutionGraph solutionGraph(problemGraph, solution);

    parameters.solutionName = parameters.solutionName.substr(0, parameters.solutionName.size() - 4);
    solutionGraph.save(parameters.solutionName);
    solutionGraph.saveSVG(parameters.solutionName + "-lineage-tree.svg");

    return 0;
}
catch(const runtime_error& error) {
    cerr << "error: " << error.what() << endl;
    return 1;
}